

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O1

TapBranch * __thiscall
cfd::core::DescriptorNode::GetTapBranch
          (TapBranch *__return_storage_ptr__,DescriptorNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *array_argument)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  TapBranch *this_00;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  _Rb_tree_node_base *p_Var6;
  ulong uVar7;
  mapped_type *this_01;
  pointer *ppuVar8;
  long *plVar9;
  long *plVar10;
  pointer pcVar11;
  pointer pbVar12;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __i;
  long lVar13;
  key_type *pkVar14;
  Script *object;
  size_t sVar15;
  TapBranch *tree;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  key_list;
  string target;
  string desc;
  Script script;
  Script first_script;
  DescriptorKeyReference ref;
  SchnorrPubkey local_4c8;
  long lStack_4b0;
  TapBranch *local_4a8;
  DescriptorNode *local_4a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_498;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_480;
  undefined1 *local_478;
  size_t local_470;
  undefined1 local_468 [16];
  string local_458;
  string local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  Script local_3f8;
  Script local_3b8;
  DescriptorScriptReference local_380;
  
  local_498.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
  local_498.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
  local_498.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var6 = (this->tree_node_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->tree_node_)._M_t._M_impl.super__Rb_tree_header;
  local_4a8 = __return_storage_ptr__;
  local_4a0 = this;
  local_480 = array_argument;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    do {
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_498,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var6 + 1));
      p_Var6 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  pbVar12 = local_498.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pbVar3 = local_498.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_498.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_498.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar13 = (long)local_498.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_498.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = lVar13 >> 5;
    lVar2 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cfd::core::DescriptorNode::GetTapBranch(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*)const::__0>>
              (local_498.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_498.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar13 < 0x201) {
      ::std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<cfd::core::DescriptorNode::GetTapBranch(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*)const::__0>>
                (pbVar3,pbVar12);
    }
    else {
      pkVar14 = pbVar3 + 0x10;
      ::std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<cfd::core::DescriptorNode::GetTapBranch(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*)const::__0>>
                (pbVar3,pkVar14);
      for (; pkVar14 != pbVar12; pkVar14 = pkVar14 + 1) {
        ::std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Val_comp_iter<cfd::core::DescriptorNode::GetTapBranch(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*)const::__0>>
                  (pkVar14);
      }
    }
  }
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  pcVar11 = (local_4a0->value_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_458,pcVar11,pcVar11 + (local_4a0->value_)._M_string_length);
  local_478 = local_468;
  local_470 = 0;
  local_468[0] = 0;
  Script::Script(&local_3b8);
  pbVar3 = local_498.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_498.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_498.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_4a0 = (DescriptorNode *)&local_4a0->tree_node_;
    pbVar12 = local_498.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      this_01 = ::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>_>_>
                ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>_>_>
                      *)local_4a0,pbVar12);
      if (this_01->node_type_ == kDescriptorTypeKey) {
        GetKeyReferences((DescriptorKeyReference *)&local_380,this_01,local_480);
        local_4c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_4c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_4c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar7 = (long)local_380.locking_script_.script_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start -
                (long)local_380.locking_script_._vptr_Script;
        if (uVar7 == 0) {
          ppuVar8 = (pointer *)0x0;
        }
        else {
          if ((long)uVar7 < 0) {
            ::std::__throw_bad_alloc();
          }
          ppuVar8 = (pointer *)operator_new(uVar7);
        }
        local_4c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)ppuVar8 + uVar7);
        sVar15 = (long)local_380.locking_script_.script_data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start -
                 (long)local_380.locking_script_._vptr_Script;
        local_4c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar8;
        if (sVar15 != 0) {
          local_4c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)ppuVar8;
          memmove(ppuVar8,local_380.locking_script_._vptr_Script,sVar15);
        }
        local_4c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)((long)ppuVar8 + sVar15);
        SchnorrPubkey::GetHex_abi_cxx11_((string *)&local_3f8,&local_4c8);
        ::std::__cxx11::string::operator=((string *)&local_478,(string *)&local_3f8);
        if (local_3f8._vptr_Script !=
            (_func_int **)
            ((long)&local_3f8.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8U)) {
          operator_delete(local_3f8._vptr_Script);
        }
        if ((pointer *)
            local_4c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
          operator_delete(local_4c8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        DescriptorKeyReference::~DescriptorKeyReference((DescriptorKeyReference *)&local_380);
      }
      else {
        GetReference(&local_380,this_01,local_480,(DescriptorNode *)0x0);
        bVar4 = Script::IsEmpty(&local_380.redeem_script_);
        object = &local_380.redeem_script_;
        if (bVar4) {
          object = &local_380.locking_script_;
        }
        Script::Script(&local_3f8,object);
        bVar4 = Script::IsEmpty(&local_3b8);
        if (bVar4) {
          Script::operator=(&local_3b8,&local_3f8);
        }
        Script::GetHex_abi_cxx11_(&local_438,&local_3f8);
        ::std::operator+(&local_418,"tl(",&local_438);
        plVar9 = (long *)::std::__cxx11::string::append((char *)&local_418);
        ppuVar8 = (pointer *)
                  ((long)&local_4c8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data + 0x10);
        plVar10 = plVar9 + 2;
        if ((pointer *)*plVar9 == (pointer *)plVar10) {
          local_4c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar10;
          lStack_4b0 = plVar9[3];
          local_4c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar8;
        }
        else {
          local_4c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar10;
          local_4c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar9;
        }
        local_4c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar9[1];
        *plVar9 = (long)plVar10;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        ::std::__cxx11::string::operator=((string *)&local_478,(string *)&local_4c8);
        if ((pointer *)
            local_4c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != ppuVar8) {
          operator_delete(local_4c8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != &local_418.field_2) {
          operator_delete(local_418._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p);
        }
        Script::~Script(&local_3f8);
        DescriptorScriptReference::~DescriptorScriptReference(&local_380);
      }
      sVar15 = pbVar12->_M_string_length;
      if (sVar15 == local_470) {
        if (sVar15 != 0) {
          iVar5 = bcmp((pbVar12->_M_dataplus)._M_p,local_478,sVar15);
          if (iVar5 != 0) goto LAB_003236ac;
        }
      }
      else {
LAB_003236ac:
        pcVar11 = (pbVar12->_M_dataplus)._M_p;
        while( true ) {
          uVar7 = ::std::__cxx11::string::find((char *)&local_458,(ulong)pcVar11,0);
          if (uVar7 == 0xffffffffffffffff) break;
          ::std::__cxx11::string::replace
                    ((ulong)&local_458,uVar7,(char *)pbVar12->_M_string_length,(ulong)local_478);
          ::std::__cxx11::string::_M_assign((string *)&local_458);
          pcVar11 = (pbVar12->_M_dataplus)._M_p;
        }
      }
      pbVar12 = pbVar12 + 1;
    } while (pbVar12 != pbVar3);
  }
  this_00 = local_4a8;
  TapBranch::TapBranch(local_4a8);
  if (local_458._M_string_length != 0) {
    iVar5 = ::std::__cxx11::string::compare((char *)&local_458);
    if (iVar5 != 0) {
      TapBranch::FromString((TapBranch *)&local_380,&local_458);
      TapBranch::operator=(this_00,(TapBranch *)&local_380);
      TapBranch::~TapBranch((TapBranch *)&local_380);
      bVar4 = TapBranch::HasTapLeaf(this_00);
      if (!bVar4) {
        bVar4 = Script::IsEmpty(&local_3b8);
        if (!bVar4) {
          local_3f8._vptr_Script = (_func_int **)0x0;
          local_3f8.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_3f8.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          TapBranch::ChangeTapLeaf
                    ((TapBranch *)&local_380,this_00,&local_3b8,
                     (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                     &local_3f8);
          TapBranch::operator=(this_00,(TapBranch *)&local_380);
          TapBranch::~TapBranch((TapBranch *)&local_380);
          ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                    ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                     &local_3f8);
        }
      }
    }
  }
  Script::~Script(&local_3b8);
  if (local_478 != local_468) {
    operator_delete(local_478);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_498);
  return this_00;
}

Assistant:

TapBranch DescriptorNode::GetTapBranch(
    std::vector<std::string>* array_argument) const {
  static auto sort_func = [](const std::string& src, const std::string& dest) {
    return src.length() > dest.length();
  };
  std::vector<std::string> key_list;
  for (const auto& tree_node : tree_node_) {
    key_list.emplace_back(tree_node.first);
  }
  std::sort(key_list.begin(), key_list.end(), sort_func);

  std::string desc = value_;
  std::string target;
  Script first_script;
  for (const auto& script_str : key_list) {
    const auto& node_ref = tree_node_.at(script_str);
    if (node_ref.node_type_ == DescriptorNodeType::kDescriptorTypeKey) {
      auto ref = node_ref.GetKeyReferences(array_argument);
      target = ref.GetSchnorrPubkey().GetHex();
    } else {
      const auto obj = node_ref.GetReference(array_argument);
      Script script = obj.HasRedeemScript() ? obj.GetRedeemScript()
                                            : obj.GetLockingScript();
      if (first_script.IsEmpty()) first_script = script;
      target = "tl(" + script.GetHex() + ")";
    }
    if (script_str != target) {
      auto offset = desc.find(script_str);
      while (offset != std::string::npos) {
        desc = desc.replace(offset, script_str.length(), target);
        offset = desc.find(script_str);
      }
    }
  }

  TapBranch tree;
  if (desc.empty() || (desc == "{}")) {
    // do nothing
  } else {
    tree = TapBranch::FromString(desc);
    if ((!tree.HasTapLeaf()) && (!first_script.IsEmpty())) {
      tree = tree.ChangeTapLeaf(first_script);
    }
  }
  return tree;
}